

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symtab.c
# Opt level: O0

void AddRef(int linenum)

{
  SymTab *pSVar1;
  Ref *local_20;
  Ref *prevref;
  Ref *ref;
  int i;
  int linenum_local;
  
  if ((Pass2 != 0) && (XrefList != 0)) {
    local_20 = (Ref *)0x0;
    for (prevref = Sym->Ref1; prevref != (Ref *)0x0; prevref = prevref->NextRef) {
      for (ref._0_4_ = 0; (int)ref < 4; ref._0_4_ = (int)ref + 1) {
        if (prevref->RefNum[(int)ref] == 0) {
          prevref->RefNum[(int)ref] = linenum;
          return;
        }
      }
      local_20 = prevref;
    }
    prevref = RefLim;
    RefLim = RefLim + 1;
    if (0x2000 < (long)RefLim - (long)SymCurr) {
      pSVar1 = (SymTab *)malloc(0x2000);
      if (pSVar1 == (SymTab *)0x0) {
        fprintf(_stderr,"     \nOut of memory - cross-reference disabled.\n");
        XrefList = 0;
        return;
      }
      SymCurr->Link = pSVar1;
      SymCurr = pSVar1;
      pSVar1->Link = (SymTab *)0x0;
      prevref = (Ref *)&pSVar1->Hunk;
      RefLim = (Ref *)(pSVar1 + 1);
    }
    prevref->NextRef = (Ref *)0x0;
    prevref->RefNum[0] = linenum;
    for (ref._0_4_ = 1; (int)ref < 4; ref._0_4_ = (int)ref + 1) {
      prevref->RefNum[(int)ref] = 0;
    }
    if (local_20 == (Ref *)0x0) {
      Sym->Ref1 = prevref;
    }
    else {
      local_20->NextRef = prevref;
    }
  }
  return;
}

Assistant:

void AddRef(linenum)
	int linenum;
/* Adds "linenum" to the list of references
 for the symbol pointed to by Sym.  */
{
	register int i;
	register struct Ref *ref, *prevref;

	if (!Pass2)
		return; /* Pass 2 only! */
	if (!XrefList)
		return; /* No cross-reference */
	prevref = NULL;
	ref = Sym->Ref1;
	while (ref) { /* Chase pointers. */
		for (i = 0; i < MAXREF; i++) { /* Scan reference entry */
			if (ref->RefNum[i] == 0) { /*  for an empty slot.  */
				ref->RefNum[i] = linenum; /* Insert new line number. */
				return;
			}
		}
		prevref = ref; /* Remember where we were. */
		ref = ref->NextRef; /* Link to the next entry. */
	}
	ref = RefLim; /* Pointer to new entry */
	RefLim++; /* Bump limit pointer. */
	if (((char *) RefLim - (char *) SymCurr) > CHUNKSIZE) {
		ref = (struct Ref *) malloc((unsigned) CHUNKSIZE);
		if (ref == NULL) {
			fprintf(stderr, "     \nOut of memory - cross-reference disabled.\n");
			XrefList = FALSE;
			return;
		}
		SymCurr->Link = (struct SymTab *) ref; /* Link from prev. chunk */
		SymCurr = (struct SymTab *) ref; /* Make the new chunk current. */
		SymCurr->Link = NULL; /* Clear forward pointer. */
		ref++; /* Skip over pointer entry. */
		RefLim = ref; /* New table limit */
		RefLim++; /* Bump it. */
	}
	ref->NextRef = NULL; /* Pointer to next entry */
	ref->RefNum[0] = linenum; /* First reference in new entry */
	for (i = 1; i < MAXREF; i++)
		ref->RefNum[i] = 0; /* Clear remaining slots. */
	if (prevref == NULL)
		Sym->Ref1 = ref; /* Link to first entry */
	else
		prevref->NextRef = ref; /* Link to next entry */
}